

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O3

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription
          (storage_t *this,mbox_t *mbox,type_index *msg_type,state_t *target_state)

{
  subscr_info_t *psVar1;
  abstract_message_box_t *paVar2;
  int iVar3;
  undefined4 extraout_var;
  iterator __position;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  _Var4;
  agent_t *paVar5;
  mbox_id_t mbox_id;
  mbox_id_t local_28;
  
  iVar3 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_28 = CONCAT44(extraout_var,iVar3);
  __position = (anonymous_namespace)::
               find<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                         ((_anonymous_namespace_ *)
                          (this->m_events).
                          super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                           *)(this->m_events).
                             super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_28,msg_type,
                          target_state);
  if (__position._M_current !=
      (this->m_events).
      super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
    ::_M_erase(&this->m_events,__position);
    psVar1 = (this->m_events).
             super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>,__gnu_cxx::__ops::_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::is_same_mbox_msg>>
                      ((this->m_events).
                       super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                       ._M_impl.super__Vector_impl_data._M_start,psVar1,local_28,msg_type);
    if (psVar1 == _Var4._M_current) {
      paVar2 = mbox->m_obj;
      paVar5 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar2->_vptr_abstract_message_box_t[4])(paVar2,msg_type,paVar5);
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription(
	const mbox_t & mbox,
	const std::type_index & msg_type,
	const state_t & target_state )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		auto existed_position = find(
				m_events, mbox_id, msg_type, target_state );
		if( existed_position != m_events.end() )
			{
				m_events.erase( existed_position );

				// Note v.5.5.9 unsubscribe_event_handlers is called for
				// mbox even if it is MPSC mbox. It is necessary for the case
				// of message delivery tracing.

				// If there is no more subscriptions to that mbox then
				// the mbox must remove information about that agent.
				if( end( m_events ) == find_if(
						begin( m_events ), end( m_events ),
						is_same_mbox_msg{ mbox_id, msg_type } ) )
					{
						// If we are here then there is no more references
						// to the mbox. And mbox must not hold reference
						// to the agent.
						mbox->unsubscribe_event_handlers( msg_type, owner() );
					}
			}
	}